

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchSource
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr destination;
  _Base_ptr *pp_Var1;
  cmMakefile *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  cmValue name;
  cmGeneratorTarget *this_01;
  string *psVar6;
  mapped_type *pmVar7;
  long lVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar9;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator<char> local_3d9;
  string *local_3d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  string filename_tmp;
  string local_360;
  string *local_340;
  string local_338;
  string pchHeader;
  cmAlphaNum local_2f8;
  cmGeneratedFileStream file;
  cmAlphaNum local_60;
  
  bVar4 = std::operator!=(language,"C");
  if ((((bVar4) && (bVar4 = std::operator!=(language,"CXX"), bVar4)) &&
      (bVar4 = std::operator!=(language,"OBJC"), bVar4)) &&
     (bVar4 = std::operator!=(language,"OBJCXX"), bVar4)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_3d8 = __return_storage_ptr__;
  std::operator+(&filename_tmp,language,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &languageToExtension,&filename_tmp,arch);
  uVar2 = languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  pp_Var1 = &languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)languageToExtension._M_t._M_impl._0_8_ == pp_Var1) {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
         languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)languageToExtension._M_t._M_impl._0_8_;
  }
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  uVar3 = languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar2;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar2,4);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
       languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
       languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
       (long)"PK\x01\x02" + 4;
  languageToExtension._M_t._M_impl._0_8_ = pp_Var1;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar3;
  pVar9 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchSources,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      *)&file);
  _Var5 = pVar9.first._M_node;
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&languageToExtension);
  std::__cxx11::string::~string((string *)&filename_tmp);
  psVar6 = local_3d8;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    GetPchHeader(&pchHeader,this,config,language,arch);
    if (pchHeader._M_string_length == 0) {
      (local_3d8->_M_dataplus)._M_p = (pointer)&local_3d8->field_2;
      local_3d8->_M_string_length = 0;
      (local_3d8->field_2)._M_local_buf[0] = '\0';
      psVar6 = local_3d8;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file,"PRECOMPILE_HEADERS_REUSE_FROM",
                 (allocator<char> *)&languageToExtension);
      name = GetProperty(this,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
      this_01 = this;
      if (name.Value != (string *)0x0) {
        this_01 = cmGlobalGenerator::FindGeneratorTarget
                            (this->LocalGenerator->GlobalGenerator,name.Value);
      }
      psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01->LocalGenerator);
      file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           (psVar6->_M_dataplus)._M_p;
      file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)psVar6->_M_string_length;
      languageToExtension._M_t._M_impl._0_8_ = 0xc;
      languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (long)"**/CMakeFiles/" + 2;
      local_340 = name.Value;
      psVar6 = GetName_abi_cxx11_(this_01);
      cmStrCat<std::__cxx11::string,char[15]>
                (&filename_tmp,(cmAlphaNum *)&file,(cmAlphaNum *)&languageToExtension,psVar6,
                 (char (*) [15])".dir/cmake_pch");
      destination = _Var5._M_node + 2;
      std::__cxx11::string::operator=((string *)destination,(string *)&filename_tmp);
      std::__cxx11::string::~string((string *)&filename_tmp);
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file,"CMAKE_LINK_PCH",(allocator<char> *)&languageToExtension);
      bVar4 = cmMakefile::IsOn(this_00,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
      if (bVar4) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file,(char (*) [2])0x627cf0,(char (*) [3])0x6976b6);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x40,(char (*) [4])0x6161a4,(char (*) [5])0x650b11);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x80,(char (*) [5])"OBJC",(char (*) [3])0x602136);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xc0,(char (*) [7])"OBJCXX",(char (*) [4])0x64d01b);
        __l._M_len = 4;
        __l._M_array = (iterator)&file;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&languageToExtension,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&filename_tmp,(allocator_type *)&local_2f8);
        lVar8 = 0xc0;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream + lVar8));
          lVar8 = lVar8 + -0x40;
        } while (lVar8 != -0x40);
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
             _Var5._M_node[2]._M_color;
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
             *(undefined4 *)&_Var5._M_node[2].field_0x4;
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)_Var5._M_node[2]._M_parent;
        if (arch->_M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3d9);
        }
        else {
          local_2f8.View_._M_len = 1;
          local_2f8.View_._M_str = "_";
          local_60.View_._M_str = (arch->_M_dataplus)._M_p;
          local_60.View_._M_len = arch->_M_string_length;
          cmStrCat<>(&local_360,&local_2f8,&local_60);
        }
        filename_tmp._M_dataplus._M_p = (pointer)local_360._M_string_length;
        filename_tmp._M_string_length = (size_type)local_360._M_dataplus._M_p;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(&languageToExtension,language);
        cmStrCat<std::__cxx11::string>
                  (&local_338,(cmAlphaNum *)&file,(cmAlphaNum *)&filename_tmp,pmVar7);
      }
      else {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file,(char (*) [2])0x627cf0,(char (*) [5])".h.c");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x40,(char (*) [4])0x6161a4,(char (*) [9])".hxx.cxx");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[10],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0x80,(char (*) [5])"OBJC",(char (*) [10])".objc.h.m");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xc0,(char (*) [7])"OBJCXX",(char (*) [15])".objcxx.hxx.mm");
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)&file;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&languageToExtension,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&filename_tmp,(allocator_type *)&local_2f8);
        lVar8 = 0xc0;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream + lVar8));
          lVar8 = lVar8 + -0x40;
        } while (lVar8 != -0x40);
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
             _Var5._M_node[2]._M_color;
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
             *(undefined4 *)&_Var5._M_node[2].field_0x4;
        file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)_Var5._M_node[2]._M_parent;
        if (arch->_M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3d9);
        }
        else {
          local_2f8.View_._M_len = 1;
          local_2f8.View_._M_str = "_";
          local_60.View_._M_str = (arch->_M_dataplus)._M_p;
          local_60.View_._M_len = arch->_M_string_length;
          cmStrCat<>(&local_360,&local_2f8,&local_60);
        }
        filename_tmp._M_dataplus._M_p = (pointer)local_360._M_string_length;
        filename_tmp._M_string_length = (size_type)local_360._M_dataplus._M_p;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(&languageToExtension,language);
        cmStrCat<std::__cxx11::string>
                  (&local_338,(cmAlphaNum *)&file,(cmAlphaNum *)&filename_tmp,pmVar7);
      }
      std::__cxx11::string::operator=((string *)destination,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_360);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&languageToExtension._M_t);
      psVar6 = local_3d8;
      file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
           _Var5._M_node[2]._M_color;
      file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
           *(undefined4 *)&_Var5._M_node[2].field_0x4;
      file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)_Var5._M_node[2]._M_parent;
      languageToExtension._M_t._M_impl._0_8_ = 4;
      languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"%s.%s.tmp" + 5
      ;
      cmStrCat<>(&filename_tmp,(cmAlphaNum *)&file,(cmAlphaNum *)&languageToExtension);
      if (local_340 == (string *)0x0) {
        cmGeneratedFileStream::cmGeneratedFileStream(&file,&filename_tmp,false,None);
        std::operator<<((ostream *)&file,"/* generated by CMake */\n");
        cmGeneratedFileStream::~cmGeneratedFileStream(&file);
        cmFileTimes::Copy(&pchHeader,&filename_tmp);
        cmSystemTools::MoveFileIfDifferent(&filename_tmp,(string *)destination);
      }
      std::__cxx11::string::~string((string *)&filename_tmp);
    }
    std::__cxx11::string::~string((string *)&pchHeader);
    if (pchHeader._M_string_length == 0) {
      return psVar6;
    }
  }
  std::__cxx11::string::string((string *)psVar6,(string *)(_Var5._M_node + 2));
  return psVar6;
}

Assistant:

std::string cmGeneratorTarget::GetPchSource(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchSources.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    if (pchHeader.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    const cmGeneratorTarget* generatorTarget = this;
    cmValue pchReuseFrom =
      generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename =
      cmStrCat(generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(),
               "/CMakeFiles/", generatorTarget->GetName(), ".dir/cmake_pch");

    // For GCC the source extension will be transformed into .h[xx].gch
    if (!this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".h.c" },
        { "CXX", ".hxx.cxx" },
        { "OBJC", ".objc.h.m" },
        { "OBJCXX", ".objcxx.hxx.mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    } else {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".c" }, { "CXX", ".cxx" }, { "OBJC", ".m" }, { "OBJCXX", ".mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    }

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      {
        cmGeneratedFileStream file(filename_tmp);
        file << "/* generated by CMake */\n";
      }
      cmFileTimes::Copy(pchHeader, filename_tmp);
      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}